

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.h
# Opt level: O0

CordRep * absl::lts_20250127::cord_internal::RemoveCrcNode(CordRep *rep)

{
  bool bVar1;
  CordRepCrc *pCVar2;
  CordRep *child;
  CordRep *rep_local;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                  ,0x37,"CordRep *absl::cord_internal::RemoveCrcNode(CordRep *)");
  }
  bVar1 = CordRep::IsCrc(rep);
  rep_local = rep;
  if (bVar1) {
    pCVar2 = CordRep::crc(rep);
    rep_local = pCVar2->child;
    bVar1 = RefcountAndFlags::IsOne(&rep->refcount);
    if (bVar1) {
      pCVar2 = CordRep::crc(rep);
      if (pCVar2 != (CordRepCrc *)0x0) {
        CordRepCrc::~CordRepCrc(pCVar2);
        operator_delete(pCVar2,0x20);
      }
    }
    else {
      CordRep::Ref(rep_local);
      CordRep::Unref(rep);
    }
  }
  return rep_local;
}

Assistant:

inline CordRep* RemoveCrcNode(CordRep* rep) {
  assert(rep != nullptr);
  if (ABSL_PREDICT_FALSE(rep->IsCrc())) {
    CordRep* child = rep->crc()->child;
    if (rep->refcount.IsOne()) {
      delete rep->crc();
    } else {
      CordRep::Ref(child);
      CordRep::Unref(rep);
    }
    return child;
  }
  return rep;
}